

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void GEO::CmdLine::initialize(void)

{
  string local_58;
  string local_38;
  
  ::(anonymous_namespace)::desc_ = (long *)operator_new(0x98);
  *::(anonymous_namespace)::desc_ = (long)(::(anonymous_namespace)::desc_ + 2);
  ::(anonymous_namespace)::desc_[1] = 0;
  *(undefined1 *)(::(anonymous_namespace)::desc_ + 2) = 0;
  *(undefined4 *)(::(anonymous_namespace)::desc_ + 5) = 0;
  ::(anonymous_namespace)::desc_[6] = 0;
  ::(anonymous_namespace)::desc_[7] = (long)(::(anonymous_namespace)::desc_ + 5);
  ::(anonymous_namespace)::desc_[8] = (long)(::(anonymous_namespace)::desc_ + 5);
  ::(anonymous_namespace)::desc_[9] = 0;
  *(undefined4 *)(::(anonymous_namespace)::desc_ + 0xb) = 0;
  ::(anonymous_namespace)::desc_[0xc] = 0;
  ::(anonymous_namespace)::desc_[0xd] = (long)(::(anonymous_namespace)::desc_ + 0xb);
  ::(anonymous_namespace)::desc_[0xe] = (long)(::(anonymous_namespace)::desc_ + 0xb);
  ::(anonymous_namespace)::desc_[0xf] = 0;
  ::(anonymous_namespace)::desc_[0x10] = 0;
  ::(anonymous_namespace)::desc_[0x11] = 0;
  ::(anonymous_namespace)::desc_[0x12] = 0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"global","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  declare_arg_group(&local_38,&local_58,ARG_FLAGS_DEFAULT);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void initialize() {
            desc_ = new CommandLineDesc;
            declare_arg_group("global", "");
        }